

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O3

string * __thiscall
vkt::SpirVAssembly::getAsmTypeDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  IntegerType type_00;
  string sign;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar2 = "%type = OpTypeInt 32 0";
  if ((int)this < 3) {
    pcVar2 = "%type = OpTypeInt 32 1";
  }
  pcVar3 = "%type = OpTypeInt 32 0";
  if ((int)this < 3) {
    pcVar3 = "%type = OpTypeInt 32 1";
  }
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,pcVar2 + 0x14,pcVar3 + 0x16);
  getBitWidthStr_abi_cxx11_(&local_58,(SpirVAssembly *)((ulong)this & 0xffffffff),type_00);
  std::operator+(&local_38,"OpTypeInt ",&local_58);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_78[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const string getAsmTypeDeclaration (IntegerType type)
{
	string sign = isSigned(type) ? " 1" : " 0";
	return "OpTypeInt " + getBitWidthStr(type) + sign;
}